

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup>::
emplaceRealloc<slang::ast::CaseAssertionExpr::ItemGroup>
          (SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup> *this,pointer pos,
          ItemGroup *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  size_type sVar3;
  pointer pIVar4;
  pointer pIVar5;
  size_type sVar6;
  pointer pIVar7;
  long lVar8;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar8 = (long)pos - (long)this->data_;
  pIVar4 = (pointer)detail::allocArray(capacity,0x18);
  *(AssertionExpr **)((long)pIVar4 + lVar8 + 0x10) = (args->body).ptr;
  sVar6 = (args->expressions).size_;
  *(undefined8 *)((long)pIVar4 + lVar8) = (args->expressions).data_;
  ((undefined8 *)((long)pIVar4 + lVar8))[1] = sVar6;
  pIVar5 = this->data_;
  sVar6 = this->len;
  if (pIVar5 + sVar6 == pos) {
    pIVar7 = pIVar4;
    if (sVar6 != 0) {
      do {
        (pIVar7->body).ptr = (pIVar5->body).ptr;
        sVar6 = (pIVar5->expressions).size_;
        (pIVar7->expressions).data_ = (pIVar5->expressions).data_;
        (pIVar7->expressions).size_ = sVar6;
        pIVar5 = pIVar5 + 1;
        pIVar7 = pIVar7 + 1;
      } while (pIVar5 != pos);
    }
  }
  else {
    pIVar7 = pIVar4;
    if (pIVar5 != pos) {
      do {
        (pIVar7->body).ptr = (pIVar5->body).ptr;
        sVar6 = (pIVar5->expressions).size_;
        (pIVar7->expressions).data_ = (pIVar5->expressions).data_;
        (pIVar7->expressions).size_ = sVar6;
        pIVar5 = pIVar5 + 1;
        pIVar7 = pIVar7 + 1;
      } while (pIVar5 != pos);
      pIVar5 = this->data_;
      sVar6 = this->len;
    }
    if (pIVar5 + sVar6 != pos) {
      puVar2 = (undefined8 *)((long)pIVar4 + lVar8);
      do {
        puVar2[5] = (pos->body).ptr;
        sVar3 = (pos->expressions).size_;
        puVar2[3] = (pos->expressions).data_;
        puVar2[4] = sVar3;
        pos = pos + 1;
        puVar2 = puVar2 + 3;
      } while (pos != pIVar5 + sVar6);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pIVar4;
  return (pointer)((long)pIVar4 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}